

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::clear_VisionFeaturePrintType
          (VisionFeaturePrint *this)

{
  if (((this->_oneof_case_[0] == 0x15) || (this->_oneof_case_[0] == 0x14)) &&
     ((this->VisionFeaturePrintType_).scene_ != (VisionFeaturePrint_Scene *)0x0)) {
    (*(((this->VisionFeaturePrintType_).scene_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void VisionFeaturePrint::clear_VisionFeaturePrintType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  switch (VisionFeaturePrintType_case()) {
    case kScene: {
      delete VisionFeaturePrintType_.scene_;
      break;
    }
    case kObjects: {
      delete VisionFeaturePrintType_.objects_;
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VISIONFEATUREPRINTTYPE_NOT_SET;
}